

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void print_stack_union(FILE *out,lemon *lemp,int *plineno)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  symbol **ppsVar4;
  symbol *psVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  void *__s;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  ushort **ppuVar13;
  void *pvVar14;
  char cVar15;
  long lVar16;
  char *pcVar17;
  int iVar18;
  byte *pbVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  char *pcVar23;
  byte *pbVar24;
  size_t nByte;
  
  iVar3 = lemp->nsymbol;
  uVar7 = iVar3 * 2;
  nByte = (long)iVar3 << 4;
  __s = lemon_malloc(nByte);
  sVar10 = 0;
  memset(__s,0,nByte);
  uVar6 = (ulong)uVar7;
  if (0 < (long)iVar3) {
    memset(__s,0,uVar6 * 8);
  }
  if (lemp->vartype != (char *)0x0) {
    sVar10 = strlen(lemp->vartype);
  }
  iVar18 = (int)sVar10;
  iVar8 = lemp->nsymbol;
  if (0 < (long)iVar8) {
    ppsVar4 = lemp->symbols;
    lVar22 = 0;
    do {
      pcVar12 = ppsVar4[lVar22]->datatype;
      if (pcVar12 != (char *)0x0) {
        sVar11 = strlen(pcVar12);
        uVar9 = (uint)sVar11;
        if ((int)(uint)sVar11 < (int)(uint)sVar10) {
          uVar9 = (uint)sVar10;
        }
        sVar10 = (size_t)uVar9;
      }
      iVar18 = (int)sVar10;
      lVar22 = lVar22 + 1;
    } while (iVar8 != lVar22);
  }
  pcVar12 = (char *)lemon_malloc((long)(iVar18 * 2 + 1));
  if (0 < lemp->nsymbol) {
    lVar22 = 0;
    do {
      psVar5 = lemp->symbols[lVar22];
      uVar9 = uVar7 | 1;
      if (((psVar5 == lemp->errsym) || (uVar9 = 0, psVar5->type != NONTERMINAL)) ||
         ((pbVar24 = (byte *)psVar5->datatype, pbVar24 == (byte *)0x0 &&
          (pbVar24 = (byte *)lemp->vartype, pbVar24 == (byte *)0x0)))) {
LAB_0010b71a:
        psVar5->dtnum = uVar9;
      }
      else {
        ppuVar13 = __ctype_b_loc();
        pbVar19 = pbVar24 + -1;
        do {
          pbVar24 = pbVar24 + 1;
          pbVar1 = pbVar19 + 1;
          uVar21 = (ulong)*pbVar1;
          pbVar19 = pbVar19 + 1;
        } while ((*(byte *)((long)*ppuVar13 + uVar21 * 2 + 1) & 0x20) != 0);
        iVar8 = 0;
        if (*pbVar1 != 0) {
          uVar20 = 0;
          do {
            pcVar12[uVar20] = (char)uVar21;
            uVar20 = uVar20 + 1;
            bVar2 = *pbVar24;
            uVar21 = (ulong)bVar2;
            pbVar24 = pbVar24 + 1;
          } while (bVar2 != 0);
          if ((int)uVar20 < 1) {
LAB_0010b655:
            iVar8 = (int)uVar20;
          }
          else {
            do {
              iVar18 = (int)uVar20;
              if ((*(byte *)((long)*ppuVar13 +
                            (ulong)(byte)pcVar12[(uVar20 & 0xffffffff) - 1] * 2 + 1) & 0x20) == 0)
              goto LAB_0010b655;
              uVar20 = (ulong)(iVar18 - 1);
            } while (1 < iVar18);
          }
        }
        pcVar12[iVar8] = '\0';
        if ((lemp->tokentype != (char *)0x0) &&
           (iVar8 = strcmp(pcVar12,lemp->tokentype), iVar8 == 0)) {
          uVar9 = 0;
          goto LAB_0010b71a;
        }
        cVar15 = *pcVar12;
        uVar9 = 0;
        pcVar23 = pcVar12;
        if (cVar15 != '\0') {
          do {
            uVar9 = (int)cVar15 + uVar9 * 0x35;
            cVar15 = pcVar23[1];
            pcVar23 = pcVar23 + 1;
          } while (cVar15 != '\0');
          uVar9 = uVar9 & 0x7fffffff;
        }
        uVar21 = (ulong)uVar9 % (ulong)uVar7;
        while( true ) {
          pcVar23 = *(char **)((long)__s + uVar21 * 8);
          if (pcVar23 == (char *)0x0) break;
          iVar8 = strcmp(pcVar23,pcVar12);
          uVar9 = (int)uVar21 + 1;
          if (iVar8 == 0) goto LAB_0010b71a;
          if (uVar7 <= uVar9) {
            uVar9 = 0;
          }
          uVar21 = (ulong)uVar9;
        }
        psVar5->dtnum = (int)uVar21 + 1;
        sVar10 = strlen(pcVar12);
        pvVar14 = lemon_malloc((long)((int)sVar10 + 1));
        *(void **)((long)__s + uVar21 * 8) = pvVar14;
        lVar16 = 0;
        do {
          cVar15 = pcVar12[lVar16];
          *(char *)((long)pvVar14 + lVar16) = cVar15;
          lVar16 = lVar16 + 1;
        } while (cVar15 != '\0');
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < lemp->nsymbol);
  }
  pcVar23 = "Parse";
  if (lemp->name != (char *)0x0) {
    pcVar23 = lemp->name;
  }
  iVar8 = *plineno;
  fwrite("#[expect(non_camel_case_types)]\n",0x20,1,(FILE *)out);
  pcVar17 = "()";
  if (lemp->tokentype != (char *)0x0) {
    pcVar17 = lemp->tokentype;
  }
  fprintf((FILE *)out,"type %sTOKENTYPE<\'i> = %s;\n",pcVar23,pcVar17);
  fwrite("#[expect(non_camel_case_types)]\n",0x20,1,(FILE *)out);
  fwrite("enum YYMINORTYPE<\'i> {\n",0x17,1,(FILE *)out);
  fwrite("    yyinit(),\n",0xe,1,(FILE *)out);
  fprintf((FILE *)out,"    yy0(%sTOKENTYPE<\'i>),\n",pcVar23);
  iVar8 = iVar8 + 6;
  if (0 < iVar3) {
    uVar21 = 0;
    do {
      if (*(long *)((long)__s + uVar21 * 8) != 0) {
        fprintf((FILE *)out,"    yy%d(%s),\n",(ulong)((int)uVar21 + 1));
        iVar8 = iVar8 + 1;
      }
      uVar21 = uVar21 + 1;
    } while (uVar6 != uVar21);
  }
  psVar5 = lemp->errsym;
  if ((psVar5 != (symbol *)0x0) && (psVar5->useCnt != 0)) {
    fprintf((FILE *)out,"    yy%d(i32),\n",(ulong)(uint)psVar5->dtnum);
    iVar8 = iVar8 + 1;
  }
  memset(pcVar12,0,*(size_t *)(pcVar12 + -8));
  fwrite("}\n",2,1,(FILE *)out);
  fwrite("impl Default for YYMINORTYPE<\'_> {\n",0x23,1,(FILE *)out);
  fwrite("    fn default() -> Self {\n",0x1b,1,(FILE *)out);
  fwrite("        YYMINORTYPE::yyinit()\n",0x1e,1,(FILE *)out);
  fwrite("    }\n",6,1,(FILE *)out);
  fwrite("}\n",2,1,(FILE *)out);
  fwrite("impl<\'i> yyStackEntry<\'i> {\n",0x1c,1,(FILE *)out);
  fprintf((FILE *)out,"    fn yy0(self) -> %sTOKENTYPE<\'i> {\n",pcVar23);
  fwrite("        if let YYMINORTYPE::yy0(v) = self.minor {\n",0x32,1,(FILE *)out);
  fwrite("            v\n",0xe,1,(FILE *)out);
  fwrite("        } else {\n",0x11,1,(FILE *)out);
  fwrite("            unreachable!()\n",0x1b,1,(FILE *)out);
  fwrite("        }\n",10,1,(FILE *)out);
  fwrite("    }\n",6,1,(FILE *)out);
  iVar8 = iVar8 + 0xe;
  if (0 < iVar3) {
    uVar21 = 0;
    do {
      if (*(long *)((long)__s + uVar21 * 8) != 0) {
        uVar7 = (int)uVar21 + 1;
        fprintf((FILE *)out,"    fn yy%d(self) -> %s {\n",(ulong)uVar7);
        fprintf((FILE *)out,"        if let YYMINORTYPE::yy%d(v) = self.minor {\n",(ulong)uVar7);
        fwrite("            v\n",0xe,1,(FILE *)out);
        fwrite("        } else {\n",0x11,1,(FILE *)out);
        fwrite("            unreachable!()\n",0x1b,1,(FILE *)out);
        fwrite("        }\n",10,1,(FILE *)out);
        fwrite("    }\n",6,1,(FILE *)out);
        fwrite("    #[allow(dead_code)]\n",0x18,1,(FILE *)out);
        fprintf((FILE *)out,"    fn yy%d_ref(&mut self) -> &mut %s {\n",(ulong)uVar7,
                *(undefined8 *)((long)__s + uVar21 * 8));
        fprintf((FILE *)out,"        if let YYMINORTYPE::yy%d(ref mut v) = self.minor {\n",
                (ulong)uVar7);
        fwrite("            v\n",0xe,1,(FILE *)out);
        fwrite("        } else {\n",0x11,1,(FILE *)out);
        fwrite("            unreachable!()\n",0x1b,1,(FILE *)out);
        fwrite("        }\n",10,1,(FILE *)out);
        fwrite("    }\n",6,1,(FILE *)out);
        iVar8 = iVar8 + 0xf;
        pvVar14 = *(void **)((long)__s + uVar21 * 8);
        if (pvVar14 != (void *)0x0) {
          memset(pvVar14,0,*(size_t *)((long)pvVar14 + -8));
        }
      }
      uVar21 = uVar21 + 1;
    } while (uVar6 != uVar21);
  }
  memset(__s,0,*(size_t *)((long)__s + -8));
  psVar5 = lemp->errsym;
  if ((psVar5 != (symbol *)0x0) && (psVar5->useCnt != 0)) {
    fprintf((FILE *)out,"    fn yy%d(self) -> i32 {\n",(ulong)(uint)psVar5->dtnum);
    fprintf((FILE *)out,"        if let YYMINORTYPE::yy%d(v) = self.minor {\n",
            (ulong)(uint)lemp->errsym->dtnum);
    fwrite("            v\n",0xe,1,(FILE *)out);
    fwrite("        } else {\n",0x11,1,(FILE *)out);
    fwrite("            unreachable!()\n",0x1b,1,(FILE *)out);
    fwrite("        }\n",10,1,(FILE *)out);
    fwrite("    }\n",6,1,(FILE *)out);
    iVar8 = iVar8 + 7;
  }
  fwrite("}\n",2,1,(FILE *)out);
  *plineno = iVar8 + 1;
  return;
}

Assistant:

void print_stack_union(
  FILE *out,                  /* The output stream */
  struct lemon *lemp,         /* The main info structure for this parser */
  int *plineno                /* Pointer to the line number */
){
  int lineno;               /* The line number of the output */
  char **types;             /* A hash table of datatypes */
  int arraysize;            /* Size of the "types" array */
  int maxdtlength;          /* Maximum length of any ".datatype" field. */
  char *stddt;              /* Standardized name for a datatype */
  int i,j;                  /* Loop counters */
  unsigned hash;            /* For hashing the name of a type */
  const char *name;         /* Name of the parser */

  /* Allocate and initialize types[] and allocate stddt[] */
  arraysize = lemp->nsymbol * 2;
  types = (char**)lemon_calloc( arraysize, sizeof(char*) );
  if( types==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }
  for(i=0; i<arraysize; i++) types[i] = 0;
  maxdtlength = 0;
  if( lemp->vartype ){
    maxdtlength = lemonStrlen(lemp->vartype);
  }
  for(i=0; i<lemp->nsymbol; i++){
    int len;
    struct symbol *sp = lemp->symbols[i];
    if( sp->datatype==0 ) continue;
    len = lemonStrlen(sp->datatype);
    if( len>maxdtlength ) maxdtlength = len;
  }
  stddt = (char*)lemon_malloc( maxdtlength*2 + 1 );
  if( stddt==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }

  /* Build a hash table of datatypes. The ".dtnum" field of each symbol
  ** is filled in with the hash index plus 1.  A ".dtnum" value of 0 is
  ** used for terminal symbols.  If there is no %default_type defined then
  ** 0 is also used as the .dtnum value for nonterminals which do not specify
  ** a datatype using the %type directive.
  */
  for(i=0; i<lemp->nsymbol; i++){
    struct symbol *sp = lemp->symbols[i];
    char *cp;
    if( sp==lemp->errsym ){
      sp->dtnum = arraysize+1;
      continue;
    }
    if( sp->type!=NONTERMINAL || (sp->datatype==0 && lemp->vartype==0) ){
      sp->dtnum = 0;
      continue;
    }
    cp = sp->datatype;
    if( cp==0 ) cp = lemp->vartype;
    j = 0;
    while( ISSPACE(*cp) ) cp++;
    while( *cp ) stddt[j++] = *cp++;
    while( j>0 && ISSPACE(stddt[j-1]) ) j--;
    stddt[j] = 0;
    if( lemp->tokentype && strcmp(stddt, lemp->tokentype)==0 ){
      sp->dtnum = 0;
      continue;
    }
    hash = 0;
    for(j=0; stddt[j]; j++){
      hash = hash*53 + stddt[j];
    }
    hash = (hash & 0x7fffffff)%arraysize;
    while( types[hash] ){
      if( strcmp(types[hash],stddt)==0 ){
        sp->dtnum = hash + 1;
        break;
      }
      hash++;
      if( hash>=(unsigned)arraysize ) hash = 0;
    }
    if( types[hash]==0 ){
      sp->dtnum = hash + 1;
      types[hash] = (char*)lemon_malloc( lemonStrlen(stddt)+1 );
      if( types[hash]==0 ){
        fprintf(stderr,"Out of memory.\n");
        exit(1);
      }
      lemon_strcpy(types[hash],stddt);
    }
  }

  /* Print out the definition of YYTOKENTYPE and YYMINORTYPE */
  name = lemp->name ? lemp->name : "Parse";
  lineno = *plineno;
  fprintf(out,"#[expect(non_camel_case_types)]\n"); lineno++;
  fprintf(out,"type %sTOKENTYPE<'i> = %s;\n",name,
    lemp->tokentype?lemp->tokentype:"()");  lineno++;
  fprintf(out,"#[expect(non_camel_case_types)]\n"); lineno++;
  fprintf(out,"enum YYMINORTYPE<'i> {\n"); lineno++;
  fprintf(out,"    yyinit(),\n"); lineno++;
  fprintf(out,"    yy0(%sTOKENTYPE<'i>),\n",name); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"    yy%d(%s),\n",i+1,types[i]); lineno++;
//    lemon_free(types[i]);
  }
  if( lemp->errsym && lemp->errsym->useCnt ){
    fprintf(out,"    yy%d(i32),\n",lemp->errsym->dtnum); lineno++;
  }
  lemon_free(stddt);
  fprintf(out,"}\n"); lineno++;

  fprintf(out,"impl Default for YYMINORTYPE<'_> {\n"); lineno++;
  fprintf(out,"    fn default() -> Self {\n"); lineno++;
  fprintf(out,"        YYMINORTYPE::yyinit()\n"); lineno++;
  fprintf(out,"    }\n"); lineno++;
  fprintf(out,"}\n"); lineno++;

  fprintf(out,"impl<'i> yyStackEntry<'i> {\n"); lineno++;
  fprintf(out,"    fn yy0(self) -> %sTOKENTYPE<'i> {\n",name); lineno++;
  fprintf(out,"        if let YYMINORTYPE::yy0(v) = self.minor {\n"); lineno++;
  fprintf(out,"            v\n"); lineno++;
  fprintf(out,"        } else {\n"); lineno++;
  fprintf(out,"            unreachable!()\n"); lineno++;
  fprintf(out,"        }\n"); lineno++;
  fprintf(out,"    }\n"); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"    fn yy%d(self) -> %s {\n",i+1,types[i]); lineno++;
    fprintf(out,"        if let YYMINORTYPE::yy%d(v) = self.minor {\n",i+1); lineno++;
    fprintf(out,"            v\n"); lineno++;
    fprintf(out,"        } else {\n"); lineno++;
    fprintf(out,"            unreachable!()\n"); lineno++; // TODO } else if YYMINORTYPE::yyinit() { return None;
    fprintf(out,"        }\n"); lineno++;
    fprintf(out,"    }\n"); lineno++;
    fprintf(out,"    #[allow(dead_code)]\n"); lineno++; // TODO generates only when needed
    fprintf(out,"    fn yy%d_ref(&mut self) -> &mut %s {\n",i+1,types[i]); lineno++;
    fprintf(out,"        if let YYMINORTYPE::yy%d(ref mut v) = self.minor {\n",i+1); lineno++;
    fprintf(out,"            v\n"); lineno++;
    fprintf(out,"        } else {\n"); lineno++;
    fprintf(out,"            unreachable!()\n"); lineno++;
    fprintf(out,"        }\n"); lineno++;
    fprintf(out,"    }\n"); lineno++;
    lemon_free(types[i]);
  }
  lemon_free(types);
  if( lemp->errsym && lemp->errsym->useCnt ){
    fprintf(out,"    fn yy%d(self) -> i32 {\n",lemp->errsym->dtnum); lineno++;
    fprintf(out,"        if let YYMINORTYPE::yy%d(v) = self.minor {\n",lemp->errsym->dtnum); lineno++;
    fprintf(out,"            v\n"); lineno++;
    fprintf(out,"        } else {\n"); lineno++;
    fprintf(out,"            unreachable!()\n"); lineno++;
    fprintf(out,"        }\n"); lineno++;
    fprintf(out,"    }\n"); lineno++;
  }
  fprintf(out,"}\n"); lineno++;

  *plineno = lineno;
}